

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

void Curl_conn_ev_data_attach(connectdata *conn,Curl_easy *data)

{
  Curl_cft_cntrl *pCVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  Curl_cfilter *pCVar5;
  
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    for (pCVar5 = conn->cfilter[lVar3]; pCVar5 != (Curl_cfilter *)0x0; pCVar5 = pCVar5->next) {
      pCVar1 = pCVar5->cft->cntrl;
      if (pCVar1 != Curl_cf_def_cntrl) {
        (*pCVar1)(pCVar5,data,1,0,(void *)0x0);
      }
    }
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

void Curl_conn_ev_data_attach(struct connectdata *conn,
                              struct Curl_easy *data)
{
  cf_cntrl_all(conn, data, TRUE, CF_CTRL_DATA_ATTACH, 0, NULL);
}